

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::dispatch::
dispatch<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>>
          (dispatch *this,
          vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
          *funcs,Function_Params *plist,Type_Conversions_State *t_conversions)

{
  int iVar1;
  pointer psVar2;
  element_type *peVar3;
  pointer ppVar4;
  bool bVar5;
  Boxed_Value *pBVar6;
  Boxed_Value *pBVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *func;
  pointer psVar8;
  long lVar9;
  long lVar10;
  size_t i;
  ulong uVar11;
  pointer ppVar12;
  Boxed_Value BVar13;
  size_t numdiffs;
  element_type *local_60;
  vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>
  ordered_funcs;
  
  ordered_funcs.
  super__Vector_base<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ordered_funcs.
  super__Vector_base<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ordered_funcs.
  super__Vector_base<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Catch::clara::std::
  vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>
  ::reserve(&ordered_funcs,
            (long)(funcs->
                  super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(funcs->
                  super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 4);
  psVar8 = (funcs->
           super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (funcs->
           super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (psVar8 == psVar2) break;
    peVar3 = (psVar8->
             super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
    iVar1 = peVar3->m_arity;
    if (iVar1 == -1) {
      numdiffs = (long)plist->m_end - (long)plist->m_begin >> 4;
      local_60 = peVar3;
      std::
      vector<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>,std::allocator<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>>>
      ::emplace_back<unsigned_long,chaiscript::dispatch::Proxy_Function_Base*>
                ((vector<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>,std::allocator<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>>>
                  *)&ordered_funcs,&numdiffs,&local_60);
    }
    else {
      pBVar6 = plist->m_begin;
      pBVar7 = plist->m_end;
      if (iVar1 == (int)((ulong)((long)pBVar7 - (long)pBVar6) >> 4)) {
        numdiffs = 0;
        lVar10 = 0x18;
        lVar9 = 0;
        for (uVar11 = 0; uVar11 < (ulong)((long)pBVar7 - (long)pBVar6 >> 4); uVar11 = uVar11 + 1) {
          bVar5 = Type_Info::bare_equal
                            ((Type_Info *)
                             ((long)&((((psVar8->
                                        super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_ptr)->m_types).
                                      super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->m_type_info +
                             lVar10),*(Type_Info **)
                                      ((long)&(pBVar6->m_data).
                                              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_ptr + lVar9));
          if (!bVar5) {
            numdiffs = numdiffs + 1;
          }
          pBVar6 = plist->m_begin;
          pBVar7 = plist->m_end;
          lVar9 = lVar9 + 0x10;
          lVar10 = lVar10 + 0x18;
        }
        local_60 = (psVar8->
                   super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
        std::
        vector<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>,std::allocator<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>>>
        ::emplace_back<unsigned_long&,chaiscript::dispatch::Proxy_Function_Base*>
                  ((vector<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>,std::allocator<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>>>
                    *)&ordered_funcs,&numdiffs,&local_60);
      }
    }
    psVar8 = psVar8 + 1;
  }
  uVar11 = 0;
  do {
    ppVar4 = ordered_funcs.
             super__Vector_base<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    ppVar12 = ordered_funcs.
              super__Vector_base<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)plist->m_end - (long)plist->m_begin >> 4) < uVar11) {
      numdiffs = (size_t)ordered_funcs.
                         super__Vector_base<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
      detail::
      dispatch_with_conversions<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>const*,std::vector<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>,std::allocator<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>>>>,std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>>
                ((detail *)this,
                 (__normal_iterator<const_std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_*,_std::vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>_>
                  )ordered_funcs.
                   super__Vector_base<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<const_std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_*,_std::vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>_>
                  *)&numdiffs,plist,t_conversions,funcs);
LAB_004a0330:
      Catch::clara::std::
      _Vector_base<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>
      ::~_Vector_base(&ordered_funcs.
                       super__Vector_base<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>
                     );
      BVar13.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = extraout_RDX._M_pi;
      BVar13.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)this;
      return (Boxed_Value)
             BVar13.m_data.
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
    }
    for (; ppVar12 != ppVar4; ppVar12 = ppVar12 + 1) {
      if ((ppVar12->first == uVar11) &&
         ((uVar11 == 0 ||
          (bVar5 = Proxy_Function_Base::filter(ppVar12->second,plist,t_conversions), bVar5)))) {
        Proxy_Function_Base::operator()
                  ((Proxy_Function_Base *)this,(Function_Params *)ppVar12->second,
                   (Type_Conversions_State *)plist);
        goto LAB_004a0330;
      }
    }
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

Boxed_Value dispatch(const Funcs &funcs, const Function_Params &plist, const Type_Conversions_State &t_conversions) {
      std::vector<std::pair<size_t, const Proxy_Function_Base *>> ordered_funcs;
      ordered_funcs.reserve(funcs.size());

      for (const auto &func : funcs) {
        const auto arity = func->get_arity();

        if (arity == -1) {
          ordered_funcs.emplace_back(plist.size(), func.get());
        } else if (arity == static_cast<int>(plist.size())) {
          size_t numdiffs = 0;
          for (size_t i = 0; i < plist.size(); ++i) {
            if (!func->get_param_types()[i + 1].bare_equal(plist[i].get_type_info())) {
              ++numdiffs;
            }
          }
          ordered_funcs.emplace_back(numdiffs, func.get());
        }
      }

      for (size_t i = 0; i <= plist.size(); ++i) {
        for (const auto &func : ordered_funcs) {
          try {
            if (func.first == i && (i == 0 || func.second->filter(plist, t_conversions))) {
              return (*(func.second))(plist, t_conversions);
            }
          } catch (const exception::bad_boxed_cast &) {
            // parameter failed to cast, try again
          } catch (const exception::arity_error &) {
            // invalid num params, try again
          } catch (const exception::guard_error &) {
            // guard failed to allow the function to execute,
            // try again
          }
        }
      }

      return detail::dispatch_with_conversions(ordered_funcs.cbegin(), ordered_funcs.cend(), plist, t_conversions, funcs);
    }